

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O3

EStatusCode __thiscall CFFFileInput::ReadEncodings(CFFFileInput *this)

{
  pointer *pppEVar1;
  _Rb_tree_header *p_Var2;
  size_t sVar3;
  iterator __position;
  _Base_ptr p_Var4;
  EStatusCode EVar5;
  long inEncodingPosition;
  _Base_ptr p_Var6;
  _Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_> _Var7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  ulong uVar10;
  unsigned_short uVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_>,_bool> pVar12;
  EncodingsInfo *encoding;
  LongFilePositionTypeToEncodingsInfoMap offsetToEncoding;
  EncodingsInfo *local_80;
  vector<EncodingsInfo*,std::allocator<EncodingsInfo*>> *local_78;
  pair<const_long_long,_EncodingsInfo_*> local_70;
  _Rb_tree<long_long,_std::pair<const_long_long,_EncodingsInfo_*>,_std::_Select1st<std::pair<const_long_long,_EncodingsInfo_*>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
  local_60;
  
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar11 = this->mFontsCount;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (uVar11 != 0) {
    local_78 = (vector<EncodingsInfo*,std::allocator<EncodingsInfo*>> *)&this->mEncodings;
    uVar10 = 0;
    do {
      inEncodingPosition = GetSingleIntegerValue(this,(unsigned_short)uVar10,0x10,0);
      _Var7._M_node = &p_Var2->_M_header;
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0019b34f:
        local_80 = (EncodingsInfo *)operator_new(0x50);
        p_Var8 = &(local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var8->_M_header;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var8->_M_header;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_80->mEncoding = (Byte *)0x0;
        ReadEncoding(this,local_80,inEncodingPosition);
        __position._M_current =
             (this->mEncodings).
             super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mEncodings).super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<EncodingsInfo*,std::allocator<EncodingsInfo*>>::
          _M_realloc_insert<EncodingsInfo*const&>(local_78,__position,&local_80);
        }
        else {
          *__position._M_current = local_80;
          pppEVar1 = &(this->mEncodings).
                      super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
        local_70.second = local_80;
        local_70.first = inEncodingPosition;
        pVar12 = std::
                 _Rb_tree<long_long,std::pair<long_long_const,EncodingsInfo*>,std::_Select1st<std::pair<long_long_const,EncodingsInfo*>>,std::less<long_long>,std::allocator<std::pair<long_long_const,EncodingsInfo*>>>
                 ::_M_insert_unique<std::pair<long_long_const,EncodingsInfo*>>
                           ((_Rb_tree<long_long,std::pair<long_long_const,EncodingsInfo*>,std::_Select1st<std::pair<long_long_const,EncodingsInfo*>>,std::less<long_long>,std::allocator<std::pair<long_long_const,EncodingsInfo*>>>
                             *)&local_60,&local_70);
        _Var7 = pVar12.first._M_node;
        uVar11 = this->mFontsCount;
      }
      else {
        do {
          p_Var9 = p_Var4;
          p_Var6 = _Var7._M_node;
          sVar3 = *(size_t *)(p_Var9 + 1);
          _Var7._M_node = p_Var9;
          if ((long)sVar3 < inEncodingPosition) {
            _Var7._M_node = p_Var6;
          }
          p_Var4 = (&p_Var9->_M_left)[(long)sVar3 < inEncodingPosition];
        } while ((&p_Var9->_M_left)[(long)sVar3 < inEncodingPosition] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)_Var7._M_node == p_Var2) goto LAB_0019b34f;
        if ((long)sVar3 < inEncodingPosition) {
          p_Var9 = p_Var6;
        }
        if (inEncodingPosition < (long)*(size_t *)(p_Var9 + 1)) goto LAB_0019b34f;
      }
      this->mTopDictIndex[uVar10].mEncoding = (EncodingsInfo *)_Var7._M_node[1]._M_parent;
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar11);
  }
  EVar5 = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_EncodingsInfo_*>,_std::_Select1st<std::pair<const_long_long,_EncodingsInfo_*>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
  ::~_Rb_tree(&local_60);
  return EVar5;
}

Assistant:

EStatusCode CFFFileInput::ReadEncodings()
{
	// read all encodings positions
	EStatusCode status = PDFHummus::eSuccess;
	LongFilePositionTypeToEncodingsInfoMap offsetToEncoding;
	LongFilePositionTypeToEncodingsInfoMap::iterator it;

	for(unsigned long i=0; i < mFontsCount && (PDFHummus::eSuccess == status); ++i)
	{
		LongFilePositionType encodingPosition = GetEncodingPosition(i);
		it = offsetToEncoding.find(encodingPosition);
		if(it == offsetToEncoding.end())
		{
			EncodingsInfo* encoding = new EncodingsInfo();
			ReadEncoding(encoding,encodingPosition);
			mEncodings.push_back(encoding);
			it = offsetToEncoding.insert(LongFilePositionTypeToEncodingsInfoMap::value_type(encodingPosition,encoding)).first;
		}
		mTopDictIndex[i].mEncoding = it->second;
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();

}